

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  bool bVar2;
  hash_t hashCode;
  uint uVar3;
  int iVar4;
  DictionaryStats *this_00;
  long lVar5;
  int *piVar6;
  
  lVar5 = *(long *)this;
  if (lVar5 == 0) {
    uVar3 = 0;
  }
  else {
    hashCode = GetHashCodeWithKey<JsUtil::CharacterBuffer<char16_t>>(key);
    uVar3 = BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,hashCode);
    lVar1 = *(long *)(this + 8);
    piVar6 = (int *)(lVar5 + (ulong)uVar3 * 4);
    uVar3 = 0;
    while( true ) {
      iVar4 = *piVar6;
      if ((long)iVar4 < 0) break;
      lVar5 = (long)iVar4 * 0x20;
      bVar2 = Js::PropertyRecordStringHashComparer<const_Js::PropertyRecord_*>::Equals
                        (*(PropertyRecord **)(lVar1 + 0x18 + lVar5),key);
      if (bVar2) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_00c379ce;
      }
      uVar3 = uVar3 + 1;
      piVar6 = (int *)(lVar5 + lVar1 + 0x10);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar4 = -1;
LAB_00c379ce:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar3);
  }
  return iVar4;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }